

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O0

void stbi_decode_DXT23_alpha_block(uchar *uncompressed,uchar *compressed)

{
  int iVar1;
  int local_20;
  int local_1c;
  int next_bit;
  int i;
  uchar *compressed_local;
  uchar *uncompressed_local;
  
  local_20 = 0;
  for (local_1c = 3; local_1c < 0x40; local_1c = local_1c + 4) {
    iVar1 = stbi_convert_bit_range
                      ((int)(uint)compressed[local_20 >> 3] >> ((byte)local_20 & 7) & 0xf,4,8);
    uncompressed[local_1c] = (uchar)iVar1;
    local_20 = local_20 + 4;
  }
  return;
}

Assistant:

void stbi_decode_DXT23_alpha_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int i, next_bit = 0;
	//	each alpha value gets 4 bits
	for( i = 3; i < 16*4; i += 4 )
	{
		uncompressed[i] = stbi_convert_bit_range(
				(compressed[next_bit>>3] >> (next_bit&7)) & 15,
				4, 8 );
		next_bit += 4;
	}
}